

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error sdf_line_to(FT_26D6_Vec *to,void *user)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  SDF_Shape *shape;
  FT_Error error;
  FT_Error local_1c;
  
  if (to != (FT_26D6_Vec *)0x0) {
    plVar1 = *(long **)((long)user + 8);
    if ((*plVar1 != to->x) || (local_1c = 0, plVar1[1] != to->y)) {
      local_1c = 0;
      if (*user == (FT_Memory)0x0) {
        local_1c = 6;
      }
      else {
        plVar3 = (long *)ft_mem_qalloc(*user,0x50,&local_1c);
        if (local_1c == 0) {
          plVar3[8] = 0;
          plVar3[9] = 0;
          plVar3[6] = 0;
          plVar3[7] = 0;
          plVar3[4] = 0;
          plVar3[5] = 0;
          plVar3[2] = 0;
          plVar3[3] = 0;
          *plVar3 = 0;
          plVar3[1] = 0;
          *(undefined4 *)(plVar3 + 8) = 1;
          lVar2 = plVar1[1];
          *plVar3 = *plVar1;
          plVar3[1] = lVar2;
          lVar2 = to->y;
          plVar3[2] = to->x;
          plVar3[3] = lVar2;
          plVar3[9] = plVar1[2];
          plVar1[2] = (long)plVar3;
          lVar2 = to->y;
          *plVar1 = to->x;
          plVar1[1] = lVar2;
          local_1c = 0;
        }
      }
    }
    return local_1c;
  }
  return 6;
}

Assistant:

static FT_Error
  sdf_line_to( const FT_26D6_Vec*  to,
               void*               user )
  {
    SDF_Shape*    shape    = ( SDF_Shape* )user;
    SDF_Edge*     edge     = NULL;
    SDF_Contour*  contour  = NULL;

    FT_Error      error    = FT_Err_Ok;
    FT_Memory     memory   = shape->memory;


    if ( !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    contour = shape->contours;

    if ( contour->last_pos.x == to->x &&
         contour->last_pos.y == to->y )
      goto Exit;

    FT_CALL( sdf_edge_new( memory, &edge ) );

    edge->edge_type = SDF_EDGE_LINE;
    edge->start_pos = contour->last_pos;
    edge->end_pos   = *to;

    edge->next        = contour->edges;
    contour->edges    = edge;
    contour->last_pos = *to;

  Exit:
    return error;
  }